

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

bool __thiscall
CppJieba::MixSegment::cut_type
          (MixSegment *this,string *str,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *res)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  undefined8 uVar4;
  undefined8 in_RDX;
  SegmentBase *in_RDI;
  Unicode unico;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff28;
  string *in_stack_ffffffffffffff30;
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  *this_00;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *in_stack_ffffffffffffff40;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *local_b0;
  undefined8 local_88;
  undefined8 local_78;
  allocator local_69;
  string local_68 [48];
  __normal_iterator<const_unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
  local_38 [3];
  undefined8 local_20;
  byte local_1;
  
  local_20 = in_RDX;
  bVar1 = SegmentBase::_getInitFlag(in_RDI);
  if (!bVar1) {
    __assert_fail("_getInitFlag()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                  ,0x7b,
                  "virtual bool CppJieba::MixSegment::cut_type(const string &, vector<string> &) const"
                 );
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::vector
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x143d6a);
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::clear
            ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x143d74);
  bVar1 = TransCode::decode(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    this_00 = local_38;
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(in_stack_ffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
    ::__normal_iterator<unsigned_short*>
              (this_00,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_ffffffffffffff28);
    std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(in_stack_ffffffffffffff28);
    __gnu_cxx::
    __normal_iterator<unsigned_short_const*,std::vector<unsigned_short,std::allocator<unsigned_short>>>
    ::__normal_iterator<unsigned_short*>
              (this_00,(__normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
                        *)in_stack_ffffffffffffff28);
    iVar2 = (*(in_RDI->super_ISegment)._vptr_ISegment[7])(in_RDI,local_78,local_88,local_20);
    local_1 = (byte)iVar2 & 1;
    local_b0 = in_stack_ffffffffffffff40;
  }
  else {
    pcVar3 = strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                     ,0x2f);
    if (pcVar3 == (char *)0x0) {
      local_b0 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)0x145c62;
    }
    else {
      local_b0 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 strrchr("/workspace/llm4binary/github/license_all_cmakelists_25/jannson[P]cppjieba/src/MixSegment.hpp"
                         ,0x2f);
      local_b0 = (vector<unsigned_short,_std::allocator<unsigned_short>_> *)((long)local_b0 + 1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"str[%s] decode failed.",&local_69);
    uVar4 = std::__cxx11::string::c_str();
    Limonp::Logger::LoggingF(4,(char *)local_b0,0x81,(string *)local_68,uVar4);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
    local_1 = 0;
  }
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::~vector(local_b0);
  return (bool)(local_1 & 1);
}

Assistant:

virtual bool cut_type(const string& str, vector<string>& res)const
            {
				assert(_getInitFlag());
                Unicode unico;
#ifdef NO_FILTER
                unico.clear();
                if(!TransCode::decode(str, unico))
                {
                    LogFatal("str[%s] decode failed.", str.c_str());
                    return false;
                }
                return cut_type(unico.begin(), unico.end(), res);
#else
                const char * const cstr = str.c_str();
                uint size = str.size();
                uint offset = 0;
                string subs;
                int ret;
                uint len;
                while(offset < size)
                {
                    const char * const nstr = cstr + offset;
                    uint nsize = size - offset;
                    if(-1 == (ret = filterAscii(nstr, nsize, len)) || 0 == len || len > nsize)
                    {
                        LogFatal("str[%s] illegal.", cstr);
                        return false;
                    }
                    subs.assign(nstr, len);
                    if(!ret)
                    {
                        res.push_back(subs);
                    }
                    else
                    {
                        unico.clear();
                        if(!TransCode::decode(subs, unico))
                        {
                            LogFatal("str[%s] decode failed.", subs.c_str());
                            return false;
                        }
                        cut_type(unico.begin(), unico.end(), res);
                    }
                    offset += len;
                }
                return true;
#endif
            }